

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkShareOptimize(Abc_ShaMan_t *p,int fAnd)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Abc_Aig_t *pMan;
  int *piVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar11;
  uint uVar12;
  Abc_Obj_t *pAVar13;
  int Entry;
  Abc_Obj_t *p0;
  Vec_Int_t *pVVar14;
  ulong uVar15;
  int *pBeg2;
  int *pBeg1;
  int *piVar16;
  Vec_Int_t *vInput2;
  Vec_Int_t *vInput;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  int local_5c;
  Vec_Int_t *local_58;
  Abc_ShaMan_t *local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_5c = fAnd;
  Abc_NtkShareFindBestMatch(p->vBuckets,&local_68,&local_70);
  local_50 = p;
  pVVar14 = local_70;
  pVVar9 = local_68;
  do {
    if (pVVar9 == (Vec_Int_t *)0x0) {
      return;
    }
    if (pVVar9->nSize < 1) goto LAB_002572f1;
    uVar12 = *pVVar9->pArray;
    if ((int)uVar12 < 0) {
LAB_00257310:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    pVVar5 = p->pNtk->vObjs;
    uVar2 = pVVar5->nSize;
    if ((int)uVar2 <= (int)(uVar12 >> 1)) goto LAB_002572d2;
    if (pVVar14->nSize < 1) goto LAB_002572f1;
    uVar3 = *pVVar14->pArray;
    if ((int)uVar3 < 0) goto LAB_00257310;
    if (uVar2 <= uVar3 >> 1) goto LAB_002572d2;
    ppvVar6 = pVVar5->pArray;
    p0 = (Abc_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)ppvVar6[uVar12 >> 1]);
    pAVar13 = (Abc_Obj_t *)((ulong)(uVar3 & 1) ^ (ulong)ppvVar6[uVar3 >> 1]);
    pMan = (Abc_Aig_t *)p->pNtk->pManFunc;
    local_70 = pVVar14;
    local_68 = pVVar9;
    if (local_5c == 0) {
      pAVar13 = Abc_AigXor(pMan,p0,pAVar13);
    }
    else {
      pAVar13 = Abc_AigAnd(pMan,p0,pAVar13);
    }
    p->nCountGates = p->nCountGates + 1;
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 0x10;
    p_00->nSize = 0;
    piVar10 = (int *)malloc(0x40);
    p_00->pArray = piVar10;
    if ((pVVar9->nSize < 1) || (Vec_IntPush(p_00,*pVVar9->pArray), pVVar9->nSize < 2)) {
LAB_002572f1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Vec_IntPush(p_00,pVVar9->pArray[1]);
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 0x10;
    p_01->nSize = 0;
    piVar10 = (int *)malloc(0x40);
    p_01->pArray = piVar10;
    if ((pVVar14->nSize < 1) || (Vec_IntPush(p_01,*pVVar14->pArray), pVVar14->nSize < 2))
    goto LAB_002572f1;
    Vec_IntPush(p_01,pVVar14->pArray[1]);
    p_02 = (Vec_Int_t *)malloc(0x10);
    p_02->nCap = 0x10;
    p_02->nSize = 0;
    piVar10 = (int *)malloc(0x40);
    p_02->pArray = piVar10;
    uVar15 = (ulong)pAVar13 & 0xfffffffffffffffe;
    if (*(int *)(uVar15 + 0x10) < 0) {
LAB_0025732f:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    uVar12 = (uint)pAVar13 & 1;
    Vec_IntPush(p_02,uVar12 + *(int *)(uVar15 + 0x10) * 2);
    local_58 = p_02;
    local_48 = uVar15;
    Vec_IntPush(p_02,*(uint *)(uVar15 + 0x14) >> 0xc);
    pVVar9->pArray = pVVar9->pArray + 2;
    piVar7 = pVVar14->pArray;
    piVar10 = piVar7 + 2;
    pVVar14->pArray = piVar10;
    pVVar9->nSize = pVVar9->nSize + -2;
    iVar4 = pVVar14->nSize;
    pVVar14->nSize = iVar4 + -2;
    piVar16 = pVVar9->pArray;
    piVar1 = piVar16 + pVVar9->nSize;
    piVar7 = piVar7 + iVar4;
    local_40 = pVVar14;
    local_38 = pVVar9;
    if (2 < iVar4 && 0 < (long)pVVar9->nSize) {
      do {
        iVar4 = *piVar16;
        Entry = *piVar10;
        if (iVar4 == Entry) {
          piVar16 = piVar16 + 1;
          Vec_IntPush(local_58,iVar4);
          piVar10 = piVar10 + 1;
        }
        else {
          if (iVar4 < Entry) {
            piVar16 = piVar16 + 1;
            pVVar14 = p_00;
            Entry = iVar4;
          }
          else {
            piVar10 = piVar10 + 1;
            pVVar14 = p_01;
          }
          Vec_IntPush(pVVar14,Entry);
        }
      } while ((piVar16 < piVar1) && (piVar10 < piVar7));
    }
    for (; piVar16 < piVar1; piVar16 = piVar16 + 1) {
      Vec_IntPush(p_00,*piVar16);
    }
    for (; p = local_50, piVar10 < piVar7; piVar10 = piVar10 + 1) {
      Vec_IntPush(p_01,*piVar10);
    }
    local_38->pArray = local_38->pArray + -2;
    local_40->pArray = local_40->pArray + -2;
    local_38->nSize = local_38->nSize + 2;
    local_40->nSize = local_40->nSize + 2;
    Vec_IntPush(p_00,local_50->vObj2Lit->nSize);
    Vec_IntPush(p_01,p->vObj2Lit->nSize);
    if (*(int *)(local_48 + 0x10) < 0) goto LAB_0025732f;
    Vec_IntPush(p->vObj2Lit,uVar12 + *(int *)(local_48 + 0x10) * 2);
    pVVar14 = local_58;
    if (p_00->nSize < 2) {
LAB_002572d2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar12 = p_00->nSize - 2;
    if (p->vBuckets->nSize <= (int)uVar12) goto LAB_002572d2;
    puVar8 = (uint *)p->vBuckets->pArray[uVar12];
    uVar12 = puVar8[1];
    if (uVar12 == *puVar8) {
      if ((int)uVar12 < 0x10) {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc(0x80);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),0x80);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = 0x10;
      }
      else {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc((ulong)uVar12 << 4);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),(ulong)uVar12 << 4);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = uVar12 * 2;
      }
    }
    else {
      pvVar11 = *(void **)(puVar8 + 2);
    }
    uVar12 = puVar8[1];
    puVar8[1] = uVar12 + 1;
    *(Vec_Int_t **)((long)pvVar11 + (long)(int)uVar12 * 8) = p_00;
    if (p_01->nSize < 2) goto LAB_002572d2;
    uVar12 = p_01->nSize - 2;
    if (p->vBuckets->nSize <= (int)uVar12) goto LAB_002572d2;
    puVar8 = (uint *)p->vBuckets->pArray[uVar12];
    uVar12 = puVar8[1];
    if (uVar12 == *puVar8) {
      if ((int)uVar12 < 0x10) {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc(0x80);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),0x80);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = 0x10;
      }
      else {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc((ulong)uVar12 << 4);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),(ulong)uVar12 << 4);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = uVar12 * 2;
      }
    }
    else {
      pvVar11 = *(void **)(puVar8 + 2);
    }
    uVar12 = puVar8[1];
    puVar8[1] = uVar12 + 1;
    *(Vec_Int_t **)((long)pvVar11 + (long)(int)uVar12 * 8) = p_01;
    iVar4 = pVVar14->nSize;
    if (iVar4 < 2) goto LAB_002572d2;
    uVar12 = iVar4 - 2;
    if (p->vBuckets->nSize <= (int)uVar12) goto LAB_002572d2;
    puVar8 = (uint *)p->vBuckets->pArray[uVar12];
    uVar12 = puVar8[1];
    if (uVar12 == *puVar8) {
      if ((int)uVar12 < 0x10) {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc(0x80);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),0x80);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = 0x10;
      }
      else {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar11 = malloc((ulong)uVar12 << 4);
        }
        else {
          pvVar11 = realloc(*(void **)(puVar8 + 2),(ulong)uVar12 << 4);
        }
        *(void **)(puVar8 + 2) = pvVar11;
        *puVar8 = uVar12 * 2;
      }
    }
    else {
      pvVar11 = *(void **)(puVar8 + 2);
    }
    pVVar9 = local_68;
    uVar12 = puVar8[1];
    puVar8[1] = uVar12 + 1;
    *(Vec_Int_t **)((long)pvVar11 + (long)(int)uVar12 * 8) = pVVar14;
    if (local_68->pArray != (int *)0x0) {
      free(local_68->pArray);
    }
    free(pVVar9);
    pVVar14 = local_70;
    if (local_70->pArray != (int *)0x0) {
      free(local_70->pArray);
    }
    free(pVVar14);
    Abc_NtkShareFindBestMatch(p->vBuckets,&local_68,&local_70);
    pVVar14 = local_70;
    pVVar9 = local_68;
  } while( true );
}

Assistant:

void Abc_NtkShareOptimize( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Obj_t * pObj, * pObj0, * pObj1;
    Vec_Int_t * vInput, * vInput2;
    Vec_Int_t * vNew, * vOld1, * vOld2;
    int i;
    for ( i = 0; ; i++ )
    {
        Abc_NtkShareFindBestMatch( p->vBuckets, &vInput, &vInput2 );
        if ( vInput == NULL )
            break;

        // create new node
        pObj0 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput,  0) );
        pObj1 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput2, 0) );
        if ( fAnd )
            pObj  = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        else
            pObj  = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        p->nCountGates++;

        // save new node
        vOld1 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  0) );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  1) );
        vOld2 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 0) );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 1) );
        vNew  = Vec_IntAlloc( 16 );  Vec_IntPush( vNew,  Abc_ObjToLit(pObj) );        Vec_IntPush( vNew, Abc_ObjLevel(Abc_ObjRegular(pObj)) );

        // compute new arrays
        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Vec_IntTwoSplit( vInput, vInput2, vNew, vOld1, vOld2 );

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        // add to the old ones
        Vec_IntPush( vOld1, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( vOld2, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );

        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld1)-SHARE_NUM), vOld1 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld2)-SHARE_NUM), vOld2 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vNew)-SHARE_NUM), vNew );

        Vec_IntFree( vInput );
        Vec_IntFree( vInput2 );
    }
}